

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

int cpu_x86_get_descr_debug_x86_64
              (CPUX86State *env,uint selector,target_ulong *base,uint *limit,uint *flags)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  undefined8 in_RAX;
  SegmentCache *pSVar4;
  int iVar5;
  target_ulong addr;
  uint32_t e2;
  uint32_t e1;
  
  pSVar4 = &env->ldt;
  if ((selector & 4) == 0) {
    pSVar4 = &env->gdt;
  }
  iVar5 = 0;
  if ((selector | 7) <= pSVar4->limit) {
    addr = (long)(int)(selector & 0xfffffff8) + pSVar4->base;
    iVar5 = 0;
    _e2 = in_RAX;
    iVar2 = cpu_memory_rw_debug_x86_64((CPUState *)(env[-6].mtrr_var + 4),addr,&e1,4,false);
    if (iVar2 == 0) {
      iVar5 = 0;
      iVar2 = cpu_memory_rw_debug_x86_64((CPUState *)(env[-6].mtrr_var + 4),addr + 4,&e2,4,false);
      if (iVar2 == 0) {
        uVar3 = e2 & 0xf0000 | e1 & 0xffff;
        uVar1 = uVar3 << 0xc | 0xfff;
        if ((e2 >> 0x17 & 1) == 0) {
          uVar1 = uVar3;
        }
        *base = (ulong)(e2 & 0xff000000 | e1 >> 0x10 | (e2 & 0xff) << 0x10);
        *limit = uVar1;
        *flags = e2;
        iVar5 = 1;
      }
    }
  }
  return iVar5;
}

Assistant:

int cpu_x86_get_descr_debug(CPUX86State *env, unsigned int selector,
                            target_ulong *base, unsigned int *limit,
                            unsigned int *flags)
{
    CPUState *cs = env_cpu(env);
    SegmentCache *dt;
    target_ulong ptr;
    uint32_t e1, e2;
    int index;

    if (selector & 0x4)
        dt = &env->ldt;
    else
        dt = &env->gdt;
    index = selector & ~7;
    ptr = dt->base + index;
    if ((index + 7) > dt->limit
        || cpu_memory_rw_debug(cs, ptr, (uint8_t *)&e1, sizeof(e1), 0) != 0
        || cpu_memory_rw_debug(cs, ptr+4, (uint8_t *)&e2, sizeof(e2), 0) != 0)
        return 0;

    *base = ((e1 >> 16) | ((e2 & 0xff) << 16) | (e2 & 0xff000000));
    *limit = (e1 & 0xffff) | (e2 & 0x000f0000);
    if (e2 & DESC_G_MASK)
        *limit = (*limit << 12) | 0xfff;
    *flags = e2;

    return 1;
}